

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_dart.cpp
# Opt level: O3

string * flatbuffers::dart::DartGenerator::ImportAliasName
                   (string *__return_storage_ptr__,string *ns)

{
  ulong uVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
  uVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
  while (uVar1 != 0xffffffffffffffff) {
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,(char *)0x1,0x36223c);
    uVar1 = std::__cxx11::string::find((char)__return_storage_ptr__,0x2e);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string ImportAliasName(const std::string &ns) {
    std::string ret;
    ret.assign(ns);
    size_t pos = ret.find('.');
    while (pos != std::string::npos) {
      ret.replace(pos, 1, "_");
      pos = ret.find('.', pos + 1);
    }

    return ret;
  }